

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Reals __thiscall Omega_h::divide_each_maybe_zero(Omega_h *this,Reals *a,Reals *b)

{
  double dVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  long lVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Reals RVar12;
  Write<double> c;
  type f;
  Write<double> WStack_f8;
  Write<signed_char> local_e8;
  undefined1 local_d8 [32];
  long local_b8;
  Write<signed_char> local_b0;
  Write<double> local_a0;
  uint local_90;
  Write<double> local_88;
  Write<double> local_78;
  Write<double> local_68;
  uint local_58;
  Write<double> local_50;
  Write<double> local_40;
  
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar9 = pAVar2->size;
  }
  else {
    uVar9 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (a->write_).shared_alloc_.alloc;
  if ((uVar9 & 0x7fffffff8) == 0) {
    if (((ulong)pAVar3 & 1) == 0) {
      sVar7 = pAVar3->size;
    }
    else {
      sVar7 = (ulong)pAVar3 >> 3;
    }
    if ((sVar7 & 0x7fffffff8) != 0) {
      fail("assertion %s failed at %s +%d\n","a.size() == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x8f);
    }
    Write<double>::Write((Write<signed_char> *)this,(Write<signed_char> *)a);
    pvVar5 = extraout_RDX_00;
  }
  else {
    if (((ulong)pAVar3 & 1) == 0) {
      sVar7 = pAVar3->size;
    }
    else {
      sVar7 = (ulong)pAVar3 >> 3;
    }
    if (((ulong)pAVar2 & 1) == 0) {
      sVar8 = pAVar2->size;
    }
    else {
      sVar8 = (ulong)pAVar2 >> 3;
    }
    local_58 = divide_no_remainder<int>((int)(sVar7 >> 3),(int)(sVar8 >> 3));
    pAVar2 = (a->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      sVar7 = pAVar2->size;
    }
    else {
      sVar7 = (ulong)pAVar2 >> 3;
    }
    std::__cxx11::string::string((string *)local_d8,"",(allocator *)&local_a0);
    Write<double>::Write(&WStack_f8,(LO)(sVar7 >> 3),(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    Write<double>::Write(&local_68,&b->write_);
    Write<double>::Write(&local_50,&WStack_f8);
    Write<double>::Write(&local_40,&a->write_);
    pAVar2 = (b->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      sVar7 = pAVar2->size;
    }
    else {
      sVar7 = (ulong)pAVar2 >> 3;
    }
    Write<double>::Write(&local_a0,&local_68);
    local_90 = local_58;
    Write<double>::Write(&local_88,&local_50);
    Write<double>::Write(&local_78,&local_40);
    uVar6 = (uint)(sVar7 >> 3);
    if (0 < (int)uVar6) {
      entering_parallel = 1;
      Write<double>::Write((Write<signed_char> *)local_d8,(Write<signed_char> *)&local_a0);
      local_d8._16_4_ = local_90;
      Write<double>::Write((Write<signed_char> *)(local_d8 + 0x18),(Write<signed_char> *)&local_88);
      Write<double>::Write(&local_b0,(Write<signed_char> *)&local_78);
      entering_parallel = 0;
      lVar4 = 0;
      uVar9 = 0;
      if (0 < (int)local_d8._16_4_) {
        uVar9 = (ulong)(uint)local_d8._16_4_;
      }
      for (uVar10 = 0; uVar10 != (uVar6 & 0x7fffffff); uVar10 = uVar10 + 1) {
        dVar1 = *(double *)(local_d8._8_8_ + uVar10 * 8);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
            *(double *)(local_b8 + uVar11 * 8 + lVar4) =
                 *(double *)((long)local_b0.shared_alloc_.direct_ptr + uVar11 * 8 + lVar4) /
                 *(double *)(local_d8._8_8_ + uVar10 * 8);
          }
        }
        else {
          for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
            dVar1 = *(double *)((long)local_b0.shared_alloc_.direct_ptr + uVar11 * 8 + lVar4);
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              fail("assertion %s failed at %s +%d\n","a[i * width + j] == 0.0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
                   ,0x9b);
            }
            *(undefined8 *)(local_b8 + uVar11 * 8 + lVar4) = 0;
          }
        }
        lVar4 = lVar4 + (long)(int)local_d8._16_4_ * 8;
      }
      divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0
                ((__0 *)local_d8);
    }
    divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0((__0 *)&local_a0)
    ;
    Write<double>::Write(&local_e8,(Write<signed_char> *)&WStack_f8);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_e8);
    Write<double>::~Write((Write<double> *)&local_e8);
    divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0((__0 *)&local_68)
    ;
    Write<double>::~Write(&WStack_f8);
    pvVar5 = extraout_RDX;
  }
  RVar12.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar12.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar12.write_.shared_alloc_;
}

Assistant:

Reals divide_each_maybe_zero(Reals a, Reals b) {
  if (b.size() == 0) {
    OMEGA_H_CHECK(a.size() == 0);
    return a;
  }
  auto width = divide_no_remainder(a.size(), b.size());
  Write<Real> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (b[i] != 0.0) {
      for (Int j = 0; j < width; ++j) {
        c[i * width + j] = a[i * width + j] / b[i];
      }
    } else {
      for (Int j = 0; j < width; ++j) {
        OMEGA_H_CHECK(a[i * width + j] == 0.0);
        c[i * width + j] = 0.0;
      }
    }
  };
  parallel_for(b.size(), f, "divide_maybe_zero");
  return c;
}